

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  Scene *pSVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  int iVar18;
  byte bVar19;
  byte bVar20;
  long lVar21;
  NodeRef root;
  size_t sVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  byte bVar27;
  undefined4 uVar28;
  ulong uVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  NodeRef *pNVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  Precalculations pre;
  undefined1 local_1958 [16];
  RayK<4> *local_1948;
  undefined4 local_193c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1938;
  RTCFilterFunctionNArguments args;
  RTCHitN local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  uint uStack_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar35 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar39 = ZEXT816(0) << 0x40;
    uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar39,5);
    uVar33 = vpcmpeqd_avx512vl(auVar35,(undefined1  [16])valid_i->field_0);
    uVar33 = ((byte)uVar9 & 0xf) & uVar33;
    bVar27 = (byte)uVar33;
    if (bVar27 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar99 = ZEXT1664(auVar35);
      auVar36 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar35);
      auVar58._8_4_ = 0x219392ef;
      auVar58._0_8_ = 0x219392ef219392ef;
      auVar58._12_4_ = 0x219392ef;
      uVar25 = vcmpps_avx512vl(auVar36,auVar58,1);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar100 = ZEXT1664(auVar36);
      auVar37 = vdivps_avx512vl(auVar36,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar38 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar35);
      uVar29 = vcmpps_avx512vl(auVar38,auVar58,1);
      auVar38 = vdivps_avx512vl(auVar36,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar35 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar35);
      uVar34 = vcmpps_avx512vl(auVar35,auVar58,1);
      auVar35 = vdivps_avx512vl(auVar36,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar32 = (bool)((byte)uVar25 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar37._0_4_;
      bVar32 = (bool)((byte)(uVar25 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar37._4_4_;
      bVar32 = (bool)((byte)(uVar25 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar37._8_4_;
      bVar32 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar37._12_4_;
      bVar32 = (bool)((byte)uVar29 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar38._0_4_;
      bVar32 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar38._4_4_;
      bVar32 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar38._8_4_;
      bVar32 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar38._12_4_;
      bVar32 = (bool)((byte)uVar34 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar35._0_4_;
      bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar35._4_4_;
      bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar35._8_4_;
      bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar35._12_4_;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar39,1);
      auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar25 & 1) * auVar35._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar35._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar35._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar35._12_4_;
      local_193c = (undefined4)uVar33;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39,5);
      auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar32 = (bool)((byte)uVar25 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar32 * auVar35._0_4_ | (uint)!bVar32 * 0x30;
      bVar32 = (bool)((byte)(uVar25 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * 0x30;
      bVar32 = (bool)((byte)(uVar25 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * 0x30;
      bVar32 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * 0x30;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar39,5);
      auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar32 = (bool)((byte)uVar25 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar32 * auVar35._0_4_ | (uint)!bVar32 * 0x50;
      bVar32 = (bool)((byte)(uVar25 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * 0x50;
      bVar32 = (bool)((byte)(uVar25 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * 0x50;
      bVar32 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar101 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar35 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar39);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar27 & 1) * auVar35._0_4_ |
           (uint)!(bool)(bVar27 & 1) * stack_near[0].field_0._0_4_;
      bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * stack_near[0].field_0._4_4_;
      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * stack_near[0].field_0._8_4_;
      bVar32 = SUB81(uVar33 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * stack_near[0].field_0._12_4_;
      auVar35 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar39);
      tray.tfar.field_0.i[0] =
           (uint)(bVar27 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar27 & 1) * -0x800000;
      bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = SUB81(uVar33 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1948 = ray + 0x80;
      bVar27 = (byte)((ushort)((short)uVar33 << 0xc) >> 0xc) ^ 0xf;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar102 = ZEXT1664(auVar35);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar103 = ZEXT1664(auVar35);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar104 = ZEXT1664(auVar35);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar98 = ZEXT1664(auVar35);
LAB_006a5c46:
      do {
        do {
          root.ptr = pNVar31[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006a6c46;
          pNVar31 = pNVar31 + -1;
          local_1938 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30[-1].v;
          auVar75 = ZEXT1664((undefined1  [16])local_1938);
          paVar30 = paVar30 + -1;
          uVar33 = vcmpps_avx512vl((undefined1  [16])local_1938,(undefined1  [16])tray.tfar.field_0,
                                   1);
        } while ((char)uVar33 == '\0');
        uVar28 = (undefined4)uVar33;
        if (uVar26 < (uint)POPCOUNT(uVar28)) {
LAB_006a5c85:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006a6c46;
              uVar9 = vcmpps_avx512vl(auVar75._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar9 == '\0') goto LAB_006a5c46;
              uVar33 = (ulong)((uint)root.ptr & 0xf);
              bVar17 = bVar27 & 0xf;
              if (uVar33 == 8) goto LAB_006a6b0e;
              bVar17 = bVar17 ^ 0xf;
              lVar21 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar25 = 0;
              goto LAB_006a5e5f;
            }
            lVar21 = 0;
            sVar23 = 8;
            auVar35 = auVar101._0_16_;
            do {
              sVar22 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar21 * 8);
              if (sVar22 == 8) {
                auVar75 = ZEXT1664(auVar35);
                sVar22 = sVar23;
                break;
              }
              uVar28 = *(undefined4 *)(root.ptr + 0x20 + lVar21 * 4);
              auVar69._4_4_ = uVar28;
              auVar69._0_4_ = uVar28;
              auVar69._8_4_ = uVar28;
              auVar69._12_4_ = uVar28;
              auVar14._8_8_ = tray.org.field_0._8_8_;
              auVar14._0_8_ = tray.org.field_0._0_8_;
              auVar15._8_8_ = tray.org.field_0._24_8_;
              auVar15._0_8_ = tray.org.field_0._16_8_;
              auVar16._8_8_ = tray.org.field_0._40_8_;
              auVar16._0_8_ = tray.org.field_0._32_8_;
              auVar39 = vsubps_avx(auVar69,auVar14);
              auVar86._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar39._0_4_;
              auVar86._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar39._4_4_;
              auVar86._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar39._8_4_;
              auVar86._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar39._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar21 * 4);
              auVar70._4_4_ = uVar28;
              auVar70._0_4_ = uVar28;
              auVar70._8_4_ = uVar28;
              auVar70._12_4_ = uVar28;
              auVar39 = vsubps_avx(auVar70,auVar15);
              auVar88._0_4_ = tray.rdir.field_0._16_4_ * auVar39._0_4_;
              auVar88._4_4_ = tray.rdir.field_0._20_4_ * auVar39._4_4_;
              auVar88._8_4_ = tray.rdir.field_0._24_4_ * auVar39._8_4_;
              auVar88._12_4_ = tray.rdir.field_0._28_4_ * auVar39._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar21 * 4);
              auVar71._4_4_ = uVar28;
              auVar71._0_4_ = uVar28;
              auVar71._8_4_ = uVar28;
              auVar71._12_4_ = uVar28;
              auVar39 = vsubps_avx(auVar71,auVar16);
              auVar91._0_4_ = tray.rdir.field_0._32_4_ * auVar39._0_4_;
              auVar91._4_4_ = tray.rdir.field_0._36_4_ * auVar39._4_4_;
              auVar91._8_4_ = tray.rdir.field_0._40_4_ * auVar39._8_4_;
              auVar91._12_4_ = tray.rdir.field_0._44_4_ * auVar39._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x30 + lVar21 * 4);
              auVar72._4_4_ = uVar28;
              auVar72._0_4_ = uVar28;
              auVar72._8_4_ = uVar28;
              auVar72._12_4_ = uVar28;
              auVar39 = vsubps_avx(auVar72,auVar14);
              auVar76._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar39._0_4_;
              auVar76._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar39._4_4_;
              auVar76._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar39._8_4_;
              auVar76._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar39._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x50 + lVar21 * 4);
              auVar73._4_4_ = uVar28;
              auVar73._0_4_ = uVar28;
              auVar73._8_4_ = uVar28;
              auVar73._12_4_ = uVar28;
              auVar39 = vsubps_avx(auVar73,auVar15);
              auVar78._0_4_ = tray.rdir.field_0._16_4_ * auVar39._0_4_;
              auVar78._4_4_ = tray.rdir.field_0._20_4_ * auVar39._4_4_;
              auVar78._8_4_ = tray.rdir.field_0._24_4_ * auVar39._8_4_;
              auVar78._12_4_ = tray.rdir.field_0._28_4_ * auVar39._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x70 + lVar21 * 4);
              auVar74._4_4_ = uVar28;
              auVar74._0_4_ = uVar28;
              auVar74._8_4_ = uVar28;
              auVar74._12_4_ = uVar28;
              auVar39 = vsubps_avx(auVar74,auVar16);
              auVar82._0_4_ = tray.rdir.field_0._32_4_ * auVar39._0_4_;
              auVar82._4_4_ = tray.rdir.field_0._36_4_ * auVar39._4_4_;
              auVar82._8_4_ = tray.rdir.field_0._40_4_ * auVar39._8_4_;
              auVar82._12_4_ = tray.rdir.field_0._44_4_ * auVar39._12_4_;
              auVar39 = vminps_avx(auVar86,auVar76);
              auVar36 = vminps_avx(auVar88,auVar78);
              auVar39 = vmaxps_avx(auVar39,auVar36);
              auVar36 = vminps_avx(auVar91,auVar82);
              auVar39 = vmaxps_avx(auVar39,auVar36);
              auVar37 = vmulps_avx512vl(auVar39,auVar102._0_16_);
              auVar39 = vmaxps_avx(auVar86,auVar76);
              auVar36 = vmaxps_avx(auVar88,auVar78);
              auVar36 = vminps_avx(auVar39,auVar36);
              auVar39 = vmaxps_avx(auVar91,auVar82);
              auVar39 = vminps_avx(auVar36,auVar39);
              auVar36 = vmulps_avx512vl(auVar39,auVar103._0_16_);
              auVar39 = vmaxps_avx(auVar37,(undefined1  [16])tray.tnear.field_0);
              auVar36 = vminps_avx(auVar36,(undefined1  [16])tray.tfar.field_0);
              uVar33 = vcmpps_avx512vl(auVar39,auVar36,2);
              if ((byte)uVar33 == 0) {
                auVar75 = ZEXT1664(auVar35);
                sVar22 = sVar23;
              }
              else {
                auVar39 = vblendmps_avx512vl(auVar101._0_16_,auVar37);
                bVar32 = (bool)((byte)uVar33 & 1);
                bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar33 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar33 >> 3) & 1);
                auVar75 = ZEXT1664(CONCAT412((uint)bVar8 * auVar39._12_4_ |
                                             (uint)!bVar8 * auVar37._12_4_,
                                             CONCAT48((uint)bVar7 * auVar39._8_4_ |
                                                      (uint)!bVar7 * auVar37._8_4_,
                                                      CONCAT44((uint)bVar6 * auVar39._4_4_ |
                                                               (uint)!bVar6 * auVar37._4_4_,
                                                               (uint)bVar32 * auVar39._0_4_ |
                                                               (uint)!bVar32 * auVar37._0_4_))));
                if (sVar23 != 8) {
                  pNVar31->ptr = sVar23;
                  pNVar31 = pNVar31 + 1;
                  *(undefined1 (*) [16])paVar30->v = auVar35;
                  paVar30 = paVar30 + 1;
                }
              }
              lVar21 = lVar21 + 1;
              auVar35 = auVar75._0_16_;
              sVar23 = sVar22;
            } while (lVar21 != 4);
            if (sVar22 == 8) goto LAB_006a5e09;
            uVar9 = vcmpps_avx512vl((undefined1  [16])auVar75._0_16_,
                                    (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar22;
          } while ((byte)uVar26 < (byte)POPCOUNT((int)uVar9));
          pNVar31->ptr = sVar22;
          pNVar31 = pNVar31 + 1;
          *paVar30 = auVar75._0_16_;
          paVar30 = paVar30 + 1;
LAB_006a5e09:
          iVar18 = 4;
        }
        else {
          do {
            sVar23 = 0;
            for (uVar25 = uVar33; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              sVar23 = sVar23 + 1;
            }
            bVar32 = occluded1(This,bvh,root,sVar23,&pre,ray,&tray,context);
            bVar17 = (byte)(1 << ((uint)sVar23 & 0x1f));
            if (!bVar32) {
              bVar17 = 0;
            }
            bVar27 = bVar27 | bVar17;
            uVar33 = uVar33 - 1 & uVar33;
          } while (uVar33 != 0);
          iVar18 = 3;
          if (bVar27 != 0xf) {
            auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar27 & 1) * auVar35._0_4_ |
                 (uint)!(bool)(bVar27 & 1) * tray.tfar.field_0.i[0];
            bVar32 = (bool)(bVar27 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * tray.tfar.field_0.i[1];
            bVar32 = (bool)(bVar27 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * tray.tfar.field_0.i[2];
            bVar32 = (bool)(bVar27 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * tray.tfar.field_0.i[3];
            iVar18 = 2;
          }
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar99 = ZEXT1664(auVar35);
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar100 = ZEXT1664(auVar35);
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar101 = ZEXT1664(auVar35);
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar102 = ZEXT1664(auVar35);
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar103 = ZEXT1664(auVar35);
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar104 = ZEXT1664(auVar35);
          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar98 = ZEXT1664(auVar35);
          auVar75 = ZEXT1664((undefined1  [16])local_1938);
          if (uVar26 < (uint)POPCOUNT(uVar28)) goto LAB_006a5c85;
        }
      } while (iVar18 != 3);
LAB_006a6c46:
      bVar27 = bVar27 & (byte)local_193c;
      bVar32 = (bool)(bVar27 >> 1 & 1);
      bVar6 = (bool)(bVar27 >> 2 & 1);
      bVar7 = (bool)(bVar27 >> 3 & 1);
      *(uint *)local_1948 =
           (uint)(bVar27 & 1) * -0x800000 | (uint)!(bool)(bVar27 & 1) * *(int *)local_1948;
      *(uint *)(local_1948 + 4) =
           (uint)bVar32 * -0x800000 | (uint)!bVar32 * *(int *)(local_1948 + 4);
      *(uint *)(local_1948 + 8) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_1948 + 8);
      *(uint *)(local_1948 + 0xc) =
           (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_1948 + 0xc);
    }
  }
  return;
  while( true ) {
    uVar25 = uVar25 + 1;
    lVar21 = lVar21 + 0x60;
    if (uVar33 - 8 <= uVar25) break;
LAB_006a5e5f:
    pSVar2 = context->scene;
    uVar29 = 0;
    bVar20 = bVar17;
    while (*(int *)(lVar21 + uVar29 * 4) != -1) {
      uVar1 = *(uint *)(lVar21 + -0x10 + uVar29 * 4);
      pfVar3 = (pSVar2->vertices).items[uVar1];
      uVar34 = (ulong)*(uint *)(lVar21 + -0x50 + uVar29 * 4);
      uVar24 = (ulong)*(uint *)(lVar21 + -0x40 + uVar29 * 4);
      fVar90 = pfVar3[uVar34];
      auVar64._4_4_ = fVar90;
      auVar64._0_4_ = fVar90;
      auVar64._8_4_ = fVar90;
      auVar64._12_4_ = fVar90;
      fVar90 = pfVar3[uVar34 + 1];
      auVar63._4_4_ = fVar90;
      auVar63._0_4_ = fVar90;
      auVar63._8_4_ = fVar90;
      auVar63._12_4_ = fVar90;
      fVar90 = pfVar3[uVar34 + 2];
      auVar77._4_4_ = fVar90;
      auVar77._0_4_ = fVar90;
      auVar77._8_4_ = fVar90;
      auVar77._12_4_ = fVar90;
      fVar90 = pfVar3[uVar24];
      local_1938._4_4_ = fVar90;
      local_1938._0_4_ = fVar90;
      local_1938._8_4_ = fVar90;
      local_1938._12_4_ = fVar90;
      fVar90 = pfVar3[uVar24 + 1];
      auVar96._4_4_ = fVar90;
      auVar96._0_4_ = fVar90;
      auVar96._8_4_ = fVar90;
      auVar96._12_4_ = fVar90;
      fVar90 = pfVar3[uVar24 + 2];
      auVar97._4_4_ = fVar90;
      auVar97._0_4_ = fVar90;
      auVar97._8_4_ = fVar90;
      auVar97._12_4_ = fVar90;
      uVar34 = (ulong)*(uint *)(lVar21 + -0x20 + uVar29 * 4);
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar3[uVar34]));
      auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar3[uVar34 + 1]));
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar3[uVar34 + 2]));
      auVar35 = *(undefined1 (*) [16])ray;
      auVar39 = *(undefined1 (*) [16])(ray + 0x10);
      auVar36 = *(undefined1 (*) [16])(ray + 0x20);
      auVar37 = *(undefined1 (*) [16])(ray + 0x40);
      auVar38 = *(undefined1 (*) [16])(ray + 0x50);
      auVar58 = *(undefined1 (*) [16])(ray + 0x60);
      auVar64 = vsubps_avx(auVar64,auVar35);
      auVar63 = vsubps_avx(auVar63,auVar39);
      auVar77 = vsubps_avx(auVar77,auVar36);
      auVar56 = vsubps_avx((undefined1  [16])local_1938,auVar35);
      auVar57 = vsubps_avx(auVar96,auVar39);
      auVar43 = vsubps_avx512vl(auVar97,auVar36);
      auVar44 = vsubps_avx512vl(auVar40,auVar35);
      auVar45 = vsubps_avx512vl(auVar41,auVar39);
      auVar46 = vsubps_avx512vl(auVar42,auVar36);
      auVar47 = vsubps_avx512vl(auVar44,auVar64);
      auVar48 = vsubps_avx512vl(auVar45,auVar63);
      auVar49 = vsubps_avx512vl(auVar46,auVar77);
      auVar50 = vsubps_avx512vl(auVar64,auVar56);
      auVar51 = vsubps_avx512vl(auVar63,auVar57);
      auVar52 = vsubps_avx512vl(auVar77,auVar43);
      auVar36 = vaddps_avx512vl(auVar44,auVar64);
      auVar53 = vaddps_avx512vl(auVar45,auVar63);
      auVar35 = vaddps_avx512vl(auVar46,auVar77);
      auVar39._0_4_ = auVar49._0_4_ * auVar53._0_4_;
      auVar39._4_4_ = auVar49._4_4_ * auVar53._4_4_;
      auVar39._8_4_ = auVar49._8_4_ * auVar53._8_4_;
      auVar39._12_4_ = auVar49._12_4_ * auVar53._12_4_;
      auVar39 = vfmsub231ps_fma(auVar39,auVar48,auVar35);
      auVar59._0_4_ = auVar47._0_4_ * auVar35._0_4_;
      auVar59._4_4_ = auVar47._4_4_ * auVar35._4_4_;
      auVar59._8_4_ = auVar47._8_4_ * auVar35._8_4_;
      auVar59._12_4_ = auVar47._12_4_ * auVar35._12_4_;
      auVar35 = vfmsub231ps_fma(auVar59,auVar49,auVar36);
      auVar54._0_4_ = auVar48._0_4_ * auVar36._0_4_;
      auVar54._4_4_ = auVar48._4_4_ * auVar36._4_4_;
      auVar54._8_4_ = auVar48._8_4_ * auVar36._8_4_;
      auVar54._12_4_ = auVar48._12_4_ * auVar36._12_4_;
      auVar36 = vfmsub231ps_fma(auVar54,auVar47,auVar53);
      fVar90 = auVar58._0_4_;
      auVar53._0_4_ = fVar90 * auVar36._0_4_;
      fVar93 = auVar58._4_4_;
      auVar53._4_4_ = fVar93 * auVar36._4_4_;
      fVar94 = auVar58._8_4_;
      auVar53._8_4_ = fVar94 * auVar36._8_4_;
      fVar95 = auVar58._12_4_;
      auVar53._12_4_ = fVar95 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar53,auVar38,auVar35);
      auVar35 = vfmadd231ps_fma(auVar35,auVar37,auVar39);
      auVar55._0_4_ = auVar56._0_4_ + auVar64._0_4_;
      auVar55._4_4_ = auVar56._4_4_ + auVar64._4_4_;
      auVar55._8_4_ = auVar56._8_4_ + auVar64._8_4_;
      auVar55._12_4_ = auVar56._12_4_ + auVar64._12_4_;
      auVar60._0_4_ = auVar57._0_4_ + auVar63._0_4_;
      auVar60._4_4_ = auVar57._4_4_ + auVar63._4_4_;
      auVar60._8_4_ = auVar57._8_4_ + auVar63._8_4_;
      auVar60._12_4_ = auVar57._12_4_ + auVar63._12_4_;
      auVar39 = vaddps_avx512vl(auVar77,auVar43);
      auVar36 = vmulps_avx512vl(auVar60,auVar52);
      auVar36 = vfmsub231ps_avx512vl(auVar36,auVar51,auVar39);
      auVar39 = vmulps_avx512vl(auVar39,auVar50);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar52,auVar55);
      auVar53 = vmulps_avx512vl(auVar55,auVar51);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar50,auVar60);
      auVar54 = vsubps_avx512vl(auVar56,auVar44);
      auVar61._0_4_ = fVar90 * auVar53._0_4_;
      auVar61._4_4_ = fVar93 * auVar53._4_4_;
      auVar61._8_4_ = fVar94 * auVar53._8_4_;
      auVar61._12_4_ = fVar95 * auVar53._12_4_;
      auVar39 = vfmadd231ps_avx512vl(auVar61,auVar38,auVar39);
      auVar53 = vsubps_avx512vl(auVar57,auVar45);
      auVar39 = vfmadd231ps_fma(auVar39,auVar37,auVar36);
      auVar55 = vsubps_avx512vl(auVar43,auVar46);
      auVar36 = vaddps_avx512vl(auVar56,auVar44);
      auVar56 = vaddps_avx512vl(auVar57,auVar45);
      auVar57 = vaddps_avx512vl(auVar43,auVar46);
      auVar43 = vmulps_avx512vl(auVar56,auVar55);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar53,auVar57);
      auVar57 = vmulps_avx512vl(auVar57,auVar54);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar36);
      auVar44._0_4_ = auVar36._0_4_ * auVar53._0_4_;
      auVar44._4_4_ = auVar36._4_4_ * auVar53._4_4_;
      auVar44._8_4_ = auVar36._8_4_ * auVar53._8_4_;
      auVar44._12_4_ = auVar36._12_4_ * auVar53._12_4_;
      auVar36 = vfmsub231ps_fma(auVar44,auVar54,auVar56);
      auVar36 = vmulps_avx512vl(auVar36,auVar58);
      auVar36 = vfmadd231ps_avx512vl(auVar36,auVar38,auVar57);
      auVar36 = vfmadd231ps_avx512vl(auVar36,auVar37,auVar43);
      auVar56._0_4_ = auVar35._0_4_ + auVar39._0_4_;
      auVar56._4_4_ = auVar35._4_4_ + auVar39._4_4_;
      auVar56._8_4_ = auVar35._8_4_ + auVar39._8_4_;
      auVar56._12_4_ = auVar35._12_4_ + auVar39._12_4_;
      auVar58 = vaddps_avx512vl(auVar36,auVar56);
      auVar45 = auVar99._0_16_;
      auVar56 = vandps_avx512vl(auVar58,auVar45);
      auVar57 = vmulps_avx512vl(auVar56,auVar104._0_16_);
      auVar43 = vminps_avx512vl(auVar35,auVar39);
      auVar43 = vminps_avx512vl(auVar43,auVar36);
      auVar44 = vxorps_avx512vl(auVar57,auVar98._0_16_);
      uVar9 = vcmpps_avx512vl(auVar43,auVar44,5);
      uVar34 = (ulong)*(uint *)(lVar21 + -0x30 + uVar29 * 4);
      auVar43 = vmaxps_avx512vl(auVar35,auVar39);
      auVar36 = vmaxps_avx512vl(auVar43,auVar36);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar3[uVar34]));
      uVar10 = vcmpps_avx512vl(auVar36,auVar57,2);
      auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar3[uVar34 + 1]));
      auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar3[uVar34 + 2]));
      bVar19 = ((byte)uVar9 | (byte)uVar10) & 0xf & bVar20;
      if (bVar19 != 0) {
        auVar44 = vmulps_avx512vl(auVar51,auVar49);
        auVar46 = vmulps_avx512vl(auVar47,auVar52);
        auVar59 = vmulps_avx512vl(auVar50,auVar48);
        auVar60 = vmulps_avx512vl(auVar53,auVar52);
        auVar61 = vmulps_avx512vl(auVar50,auVar55);
        auVar62 = vmulps_avx512vl(auVar54,auVar51);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar52,auVar44);
        auVar49 = vfmsub213ps_avx512vl(auVar49,auVar50,auVar46);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar51,auVar59);
        auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar60);
        auVar52 = vfmsub213ps_avx512vl(auVar54,auVar52,auVar61);
        auVar50 = vfmsub213ps_avx512vl(auVar53,auVar50,auVar62);
        auVar44 = vandps_avx512vl(auVar44,auVar45);
        auVar53 = vandps_avx512vl(auVar60,auVar45);
        uVar34 = vcmpps_avx512vl(auVar44,auVar53,1);
        auVar44 = vandps_avx512vl(auVar46,auVar45);
        auVar46 = vandps_avx512vl(auVar61,auVar45);
        uVar24 = vcmpps_avx512vl(auVar44,auVar46,1);
        auVar44 = vandps_avx512vl(auVar59,auVar45);
        auVar45 = vandps_avx512vl(auVar62,auVar45);
        uVar11 = vcmpps_avx512vl(auVar44,auVar45,1);
        bVar32 = (bool)((byte)uVar34 & 1);
        auVar45._0_4_ = (uint)bVar32 * auVar48._0_4_ | (uint)!bVar32 * auVar51._0_4_;
        bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar32 * auVar48._4_4_ | (uint)!bVar32 * auVar51._4_4_;
        bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar32 * auVar48._8_4_ | (uint)!bVar32 * auVar51._8_4_;
        bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar32 * auVar48._12_4_ | (uint)!bVar32 * auVar51._12_4_;
        bVar32 = (bool)((byte)uVar24 & 1);
        auVar46._0_4_ = (uint)bVar32 * auVar49._0_4_ | (uint)!bVar32 * auVar52._0_4_;
        bVar32 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar32 * auVar49._4_4_ | (uint)!bVar32 * auVar52._4_4_;
        bVar32 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar32 * auVar49._8_4_ | (uint)!bVar32 * auVar52._8_4_;
        bVar32 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar32 * auVar49._12_4_ | (uint)!bVar32 * auVar52._12_4_;
        bVar32 = (bool)((byte)uVar11 & 1);
        auVar48._0_4_ = (float)((uint)bVar32 * auVar47._0_4_ | (uint)!bVar32 * auVar50._0_4_);
        bVar32 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar48._4_4_ = (float)((uint)bVar32 * auVar47._4_4_ | (uint)!bVar32 * auVar50._4_4_);
        bVar32 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar48._8_4_ = (float)((uint)bVar32 * auVar47._8_4_ | (uint)!bVar32 * auVar50._8_4_);
        bVar32 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar48._12_4_ = (float)((uint)bVar32 * auVar47._12_4_ | (uint)!bVar32 * auVar50._12_4_);
        auVar50._0_4_ = fVar90 * auVar48._0_4_;
        auVar50._4_4_ = fVar93 * auVar48._4_4_;
        auVar50._8_4_ = fVar94 * auVar48._8_4_;
        auVar50._12_4_ = fVar95 * auVar48._12_4_;
        auVar38 = vfmadd213ps_fma(auVar38,auVar46,auVar50);
        auVar37 = vfmadd213ps_fma(auVar37,auVar45,auVar38);
        auVar49._0_4_ = auVar37._0_4_ + auVar37._0_4_;
        auVar49._4_4_ = auVar37._4_4_ + auVar37._4_4_;
        auVar49._8_4_ = auVar37._8_4_ + auVar37._8_4_;
        auVar49._12_4_ = auVar37._12_4_ + auVar37._12_4_;
        auVar37._0_4_ = auVar77._0_4_ * auVar48._0_4_;
        auVar37._4_4_ = auVar77._4_4_ * auVar48._4_4_;
        auVar37._8_4_ = auVar77._8_4_ * auVar48._8_4_;
        auVar37._12_4_ = auVar77._12_4_ * auVar48._12_4_;
        auVar37 = vfmadd213ps_fma(auVar63,auVar46,auVar37);
        auVar64 = vfmadd213ps_fma(auVar64,auVar45,auVar37);
        auVar37 = vrcp14ps_avx512vl(auVar49);
        auVar63 = vxorps_avx512vl(auVar49,auVar98._0_16_);
        auVar77 = auVar100._0_16_;
        auVar38 = vfnmadd213ps_avx512vl(auVar37,auVar49,auVar77);
        auVar38 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
        auVar37 = *(undefined1 (*) [16])(ray + 0x80);
        auVar47._0_4_ = auVar38._0_4_ * (auVar64._0_4_ + auVar64._0_4_);
        auVar47._4_4_ = auVar38._4_4_ * (auVar64._4_4_ + auVar64._4_4_);
        auVar47._8_4_ = auVar38._8_4_ * (auVar64._8_4_ + auVar64._8_4_);
        auVar47._12_4_ = auVar38._12_4_ * (auVar64._12_4_ + auVar64._12_4_);
        uVar9 = vcmpps_avx512vl(auVar47,auVar37,2);
        uVar10 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar12 = vcmpps_avx512vl(auVar49,auVar63,4);
        bVar19 = bVar19 & (byte)uVar9 & (byte)uVar10 & (byte)uVar12;
        if (bVar19 != 0) {
          pGVar4 = (context->scene->geometries).items[uVar1].ptr;
          uVar1 = pGVar4->mask;
          auVar38._4_4_ = uVar1;
          auVar38._0_4_ = uVar1;
          auVar38._8_4_ = uVar1;
          auVar38._12_4_ = uVar1;
          uVar9 = vptestmd_avx512vl(auVar38,*(undefined1 (*) [16])(ray + 0x90));
          bVar19 = bVar19 & (byte)uVar9 & 0xf;
          uVar34 = (ulong)bVar19;
          if (bVar19 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar51._8_4_ = 0x219392ef;
              auVar51._0_8_ = 0x219392ef219392ef;
              auVar51._12_4_ = 0x219392ef;
              uVar34 = vcmpps_avx512vl(auVar56,auVar51,5);
              auVar38 = vrcp14ps_avx512vl(auVar58);
              auVar58 = vfnmadd213ps_avx512vl(auVar58,auVar38,auVar77);
              auVar38 = vfmadd132ps_avx512vl(auVar58,auVar38,auVar38);
              fVar95 = (float)((uint)((byte)uVar34 & 1) * auVar38._0_4_);
              fVar90 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar38._4_4_);
              fVar94 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar38._8_4_);
              fVar93 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar38._12_4_);
              auVar52._0_4_ = fVar95 * auVar35._0_4_;
              auVar52._4_4_ = fVar90 * auVar35._4_4_;
              auVar52._8_4_ = fVar94 * auVar35._8_4_;
              auVar52._12_4_ = fVar93 * auVar35._12_4_;
              local_1898 = vminps_avx512vl(auVar52,auVar77);
              auVar35._0_4_ = fVar95 * auVar39._0_4_;
              auVar35._4_4_ = fVar90 * auVar39._4_4_;
              auVar35._8_4_ = fVar94 * auVar39._8_4_;
              auVar35._12_4_ = fVar93 * auVar39._12_4_;
              local_1888 = vminps_avx512vl(auVar35,auVar77);
              local_1868 = vpbroadcastd_avx512vl();
              local_1878 = vpbroadcastd_avx512vl();
              vpcmpeqd_avx2(ZEXT1632(local_1898),ZEXT1632(local_1898));
              uStack_1854 = context->user->instID[0];
              local_1858 = uStack_1854;
              uStack_1850 = uStack_1854;
              uStack_184c = uStack_1854;
              uStack_1848 = context->user->instPrimID[0];
              uStack_1844 = uStack_1848;
              uStack_1840 = uStack_1848;
              uStack_183c = uStack_1848;
              auVar35 = vblendmps_avx512vl(auVar37,auVar47);
              bVar32 = (bool)(bVar19 >> 1 & 1);
              bVar6 = (bool)(bVar19 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar19 & 1) * auVar35._0_4_ | !(bool)(bVar19 & 1) * uStack_1848;
              *(uint *)(ray + 0x84) = (uint)bVar32 * auVar35._4_4_ | !bVar32 * uStack_1848;
              *(uint *)(ray + 0x88) = (uint)bVar6 * auVar35._8_4_ | !bVar6 * uStack_1848;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar19 >> 3) * auVar35._12_4_ | !(bool)(bVar19 >> 3) * uStack_1848;
              local_1958 = vpmovm2d_avx512vl((ulong)bVar19);
              args.valid = (int *)local_1958;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = local_18c8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              local_18c8 = (RTCHitN  [16])auVar45;
              local_18b8 = auVar46;
              local_18a8 = auVar48;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar98 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar104 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar103 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar102 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar101 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar100 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar99 = ZEXT1664(auVar35);
              }
              uVar34 = vptestmd_avx512vl(local_1958,local_1958);
              if ((uVar34 & 0xf) == 0) {
                uVar34 = 0;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar98 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar104 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar103 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar102 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar101 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar100 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar99 = ZEXT1664(auVar35);
                }
                uVar34 = vptestmd_avx512vl(local_1958,local_1958);
                uVar34 = uVar34 & 0xf;
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar32 = (bool)((byte)uVar34 & 1);
                auVar62._0_4_ =
                     (uint)bVar32 * auVar35._0_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x80);
                bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar62._4_4_ =
                     (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x84);
                bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar62._8_4_ =
                     (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x88);
                bVar32 = SUB81(uVar34 >> 3,0);
                auVar62._12_4_ =
                     (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar62;
              }
              bVar32 = (bool)((byte)uVar34 & 1);
              auVar67._0_4_ = (uint)bVar32 * *(int *)local_1948 | (uint)!bVar32 * auVar37._0_4_;
              bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar67._4_4_ =
                   (uint)bVar32 * *(int *)(local_1948 + 4) | (uint)!bVar32 * auVar37._4_4_;
              bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar67._8_4_ =
                   (uint)bVar32 * *(int *)(local_1948 + 8) | (uint)!bVar32 * auVar37._8_4_;
              bVar32 = SUB81(uVar34 >> 3,0);
              auVar67._12_4_ =
                   (uint)bVar32 * *(int *)(local_1948 + 0xc) | (uint)!bVar32 * auVar37._12_4_;
              *(undefined1 (*) [16])local_1948 = auVar67;
            }
            bVar20 = ((byte)uVar34 ^ 0xf) & bVar20;
          }
        }
      }
      if (bVar20 == 0) {
        bVar20 = 0;
        break;
      }
      auVar35 = *(undefined1 (*) [16])ray;
      auVar39 = *(undefined1 (*) [16])(ray + 0x10);
      auVar37 = *(undefined1 (*) [16])(ray + 0x20);
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      auVar58 = *(undefined1 (*) [16])(ray + 0x50);
      auVar64 = *(undefined1 (*) [16])(ray + 0x60);
      auVar63 = vsubps_avx(auVar43,auVar35);
      auVar36 = vsubps_avx(auVar36,auVar39);
      auVar77 = vsubps_avx(auVar57,auVar37);
      auVar56 = vsubps_avx(auVar40,auVar35);
      auVar57 = vsubps_avx(auVar41,auVar39);
      auVar40 = vsubps_avx512vl(auVar42,auVar37);
      auVar41 = vsubps_avx512vl((undefined1  [16])local_1938,auVar35);
      auVar39 = vsubps_avx512vl(auVar96,auVar39);
      auVar37 = vsubps_avx512vl(auVar97,auVar37);
      auVar42 = vsubps_avx512vl(auVar41,auVar63);
      auVar43 = vsubps_avx512vl(auVar39,auVar36);
      auVar44 = vsubps_avx512vl(auVar37,auVar77);
      auVar45 = vsubps_avx512vl(auVar63,auVar56);
      auVar46 = vsubps_avx512vl(auVar36,auVar57);
      auVar47 = vsubps_avx512vl(auVar77,auVar40);
      auVar48 = vsubps_avx512vl(auVar56,auVar41);
      auVar49 = vsubps_avx512vl(auVar57,auVar39);
      auVar50 = vsubps_avx512vl(auVar40,auVar37);
      auVar35 = vaddps_avx512vl(auVar41,auVar63);
      auVar51 = vaddps_avx512vl(auVar39,auVar36);
      auVar52 = vaddps_avx512vl(auVar37,auVar77);
      auVar53 = vmulps_avx512vl(auVar51,auVar44);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar43,auVar52);
      auVar52 = vmulps_avx512vl(auVar52,auVar42);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar44,auVar35);
      auVar79._0_4_ = auVar43._0_4_ * auVar35._0_4_;
      auVar79._4_4_ = auVar43._4_4_ * auVar35._4_4_;
      auVar79._8_4_ = auVar43._8_4_ * auVar35._8_4_;
      auVar79._12_4_ = auVar43._12_4_ * auVar35._12_4_;
      auVar35 = vfmsub231ps_fma(auVar79,auVar42,auVar51);
      fVar90 = auVar64._0_4_;
      auVar80._0_4_ = fVar90 * auVar35._0_4_;
      fVar93 = auVar64._4_4_;
      auVar80._4_4_ = fVar93 * auVar35._4_4_;
      fVar94 = auVar64._8_4_;
      auVar80._8_4_ = fVar94 * auVar35._8_4_;
      fVar95 = auVar64._12_4_;
      auVar80._12_4_ = fVar95 * auVar35._12_4_;
      auVar35 = vfmadd231ps_avx512vl(auVar80,auVar58,auVar52);
      auVar51 = vfmadd231ps_avx512vl(auVar35,auVar38,auVar53);
      auVar83._0_4_ = auVar56._0_4_ + auVar63._0_4_;
      auVar83._4_4_ = auVar56._4_4_ + auVar63._4_4_;
      auVar83._8_4_ = auVar56._8_4_ + auVar63._8_4_;
      auVar83._12_4_ = auVar56._12_4_ + auVar63._12_4_;
      auVar35 = vaddps_avx512vl(auVar36,auVar57);
      auVar52 = vaddps_avx512vl(auVar77,auVar40);
      auVar53 = vmulps_avx512vl(auVar35,auVar47);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar46,auVar52);
      auVar52 = vmulps_avx512vl(auVar52,auVar45);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar47,auVar83);
      auVar54 = vmulps_avx512vl(auVar83,auVar46);
      auVar35 = vfmsub231ps_avx512vl(auVar54,auVar45,auVar35);
      auVar84._0_4_ = fVar90 * auVar35._0_4_;
      auVar84._4_4_ = fVar93 * auVar35._4_4_;
      auVar84._8_4_ = fVar94 * auVar35._8_4_;
      auVar84._12_4_ = fVar95 * auVar35._12_4_;
      auVar35 = vfmadd231ps_avx512vl(auVar84,auVar58,auVar52);
      auVar52 = vfmadd231ps_avx512vl(auVar35,auVar38,auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar98 = ZEXT1664(auVar53);
      auVar35 = vaddps_avx512vl(auVar56,auVar41);
      auVar39 = vaddps_avx512vl(auVar57,auVar39);
      auVar37 = vaddps_avx512vl(auVar40,auVar37);
      auVar56 = vmulps_avx512vl(auVar39,auVar50);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar49,auVar37);
      auVar37 = vmulps_avx512vl(auVar37,auVar48);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar50,auVar35);
      auVar57._0_4_ = auVar35._0_4_ * auVar49._0_4_;
      auVar57._4_4_ = auVar35._4_4_ * auVar49._4_4_;
      auVar57._8_4_ = auVar35._8_4_ * auVar49._8_4_;
      auVar57._12_4_ = auVar35._12_4_ * auVar49._12_4_;
      auVar35 = vfmsub231ps_fma(auVar57,auVar48,auVar39);
      auVar35 = vmulps_avx512vl(auVar35,auVar64);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar58,auVar37);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar38,auVar56);
      auVar40._0_4_ = auVar51._0_4_ + auVar52._0_4_;
      auVar40._4_4_ = auVar51._4_4_ + auVar52._4_4_;
      auVar40._8_4_ = auVar51._8_4_ + auVar52._8_4_;
      auVar40._12_4_ = auVar51._12_4_ + auVar52._12_4_;
      auVar39 = vaddps_avx512vl(auVar35,auVar40);
      auVar40 = auVar99._0_16_;
      auVar37 = vandps_avx512vl(auVar39,auVar40);
      auVar64 = vmulps_avx512vl(auVar37,auVar104._0_16_);
      auVar56 = vminps_avx512vl(auVar51,auVar52);
      auVar56 = vminps_avx512vl(auVar56,auVar35);
      auVar57 = vxorps_avx512vl(auVar64,auVar53);
      uVar9 = vcmpps_avx512vl(auVar56,auVar57,5);
      auVar56 = vmaxps_avx512vl(auVar51,auVar52);
      auVar35 = vmaxps_avx512vl(auVar56,auVar35);
      uVar10 = vcmpps_avx512vl(auVar35,auVar64,2);
      bVar19 = ((byte)uVar9 | (byte)uVar10) & 0xf & bVar20;
      if (bVar19 != 0) {
        auVar35 = vmulps_avx512vl(auVar46,auVar44);
        auVar64 = vmulps_avx512vl(auVar42,auVar47);
        auVar56 = vmulps_avx512vl(auVar45,auVar43);
        auVar57 = vmulps_avx512vl(auVar49,auVar47);
        auVar41 = vmulps_avx512vl(auVar45,auVar50);
        auVar54 = vmulps_avx512vl(auVar48,auVar46);
        auVar43 = vfmsub213ps_avx512vl(auVar43,auVar47,auVar35);
        auVar44 = vfmsub213ps_avx512vl(auVar44,auVar45,auVar64);
        auVar42 = vfmsub213ps_avx512vl(auVar42,auVar46,auVar56);
        auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar57);
        auVar47 = vfmsub213ps_avx512vl(auVar48,auVar47,auVar41);
        auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar54);
        auVar35 = vandps_avx512vl(auVar35,auVar40);
        auVar57 = vandps_avx512vl(auVar57,auVar40);
        uVar34 = vcmpps_avx512vl(auVar35,auVar57,1);
        auVar35 = vandps_avx512vl(auVar64,auVar40);
        auVar64 = vandps_avx512vl(auVar41,auVar40);
        uVar24 = vcmpps_avx512vl(auVar35,auVar64,1);
        auVar35 = vandps_avx512vl(auVar56,auVar40);
        auVar64 = vandps_avx512vl(auVar54,auVar40);
        uVar11 = vcmpps_avx512vl(auVar35,auVar64,1);
        bVar32 = (bool)((byte)uVar34 & 1);
        auVar41._0_4_ = (uint)bVar32 * auVar43._0_4_ | (uint)!bVar32 * auVar46._0_4_;
        bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar32 * auVar43._4_4_ | (uint)!bVar32 * auVar46._4_4_;
        bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar32 * auVar43._8_4_ | (uint)!bVar32 * auVar46._8_4_;
        bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar32 * auVar43._12_4_ | (uint)!bVar32 * auVar46._12_4_;
        bVar32 = (bool)((byte)uVar24 & 1);
        auVar43._0_4_ = (uint)bVar32 * auVar44._0_4_ | (uint)!bVar32 * auVar47._0_4_;
        bVar32 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar32 * auVar44._4_4_ | (uint)!bVar32 * auVar47._4_4_;
        bVar32 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar32 * auVar44._8_4_ | (uint)!bVar32 * auVar47._8_4_;
        bVar32 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar32 * auVar44._12_4_ | (uint)!bVar32 * auVar47._12_4_;
        bVar32 = (bool)((byte)uVar11 & 1);
        auVar65._0_4_ = (float)((uint)bVar32 * auVar42._0_4_ | (uint)!bVar32 * auVar45._0_4_);
        bVar32 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar65._4_4_ = (float)((uint)bVar32 * auVar42._4_4_ | (uint)!bVar32 * auVar45._4_4_);
        bVar32 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar65._8_4_ = (float)((uint)bVar32 * auVar42._8_4_ | (uint)!bVar32 * auVar45._8_4_);
        bVar32 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar65._12_4_ = (float)((uint)bVar32 * auVar42._12_4_ | (uint)!bVar32 * auVar45._12_4_);
        auVar92._0_4_ = fVar90 * auVar65._0_4_;
        auVar92._4_4_ = fVar93 * auVar65._4_4_;
        auVar92._8_4_ = fVar94 * auVar65._8_4_;
        auVar92._12_4_ = fVar95 * auVar65._12_4_;
        auVar35 = vfmadd213ps_fma(auVar58,auVar43,auVar92);
        auVar35 = vfmadd213ps_fma(auVar38,auVar41,auVar35);
        auVar87._0_4_ = auVar35._0_4_ + auVar35._0_4_;
        auVar87._4_4_ = auVar35._4_4_ + auVar35._4_4_;
        auVar87._8_4_ = auVar35._8_4_ + auVar35._8_4_;
        auVar87._12_4_ = auVar35._12_4_ + auVar35._12_4_;
        auVar89._0_4_ = auVar77._0_4_ * auVar65._0_4_;
        auVar89._4_4_ = auVar77._4_4_ * auVar65._4_4_;
        auVar89._8_4_ = auVar77._8_4_ * auVar65._8_4_;
        auVar89._12_4_ = auVar77._12_4_ * auVar65._12_4_;
        auVar35 = vfmadd213ps_fma(auVar36,auVar43,auVar89);
        auVar36 = vfmadd213ps_fma(auVar63,auVar41,auVar35);
        auVar35 = vrcp14ps_avx512vl(auVar87);
        auVar38 = vxorps_avx512vl(auVar87,auVar53);
        auVar64 = auVar100._0_16_;
        auVar58 = vfnmadd213ps_avx512vl(auVar35,auVar87,auVar64);
        auVar35 = vfmadd132ps_fma(auVar58,auVar35,auVar35);
        local_1938 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x80);
        auVar42._0_4_ = auVar35._0_4_ * (auVar36._0_4_ + auVar36._0_4_);
        auVar42._4_4_ = auVar35._4_4_ * (auVar36._4_4_ + auVar36._4_4_);
        auVar42._8_4_ = auVar35._8_4_ * (auVar36._8_4_ + auVar36._8_4_);
        auVar42._12_4_ = auVar35._12_4_ * (auVar36._12_4_ + auVar36._12_4_);
        uVar9 = vcmpps_avx512vl(auVar42,(undefined1  [16])local_1938,2);
        uVar10 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar12 = vcmpps_avx512vl(auVar87,auVar38,4);
        bVar19 = bVar19 & (byte)uVar9 & (byte)uVar10 & (byte)uVar12;
        if (bVar19 != 0) {
          pGVar4 = (context->scene->geometries).items[*(uint *)(lVar21 + -0x10 + uVar29 * 4)].ptr;
          uVar1 = pGVar4->mask;
          auVar36._4_4_ = uVar1;
          auVar36._0_4_ = uVar1;
          auVar36._8_4_ = uVar1;
          auVar36._12_4_ = uVar1;
          uVar9 = vptestmd_avx512vl(auVar36,*(undefined1 (*) [16])(ray + 0x90));
          bVar19 = bVar19 & (byte)uVar9 & 0xf;
          uVar34 = (ulong)bVar19;
          if (bVar19 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar13._8_4_ = 0x219392ef;
              auVar13._0_8_ = 0x219392ef219392ef;
              auVar13._12_4_ = 0x219392ef;
              uVar24 = vcmpps_avx512vl(auVar37,auVar13,5);
              auVar35 = vrcp14ps_avx512vl(auVar39);
              auVar39 = vfnmadd213ps_avx512vl(auVar39,auVar35,auVar64);
              auVar35 = vfmadd132ps_avx512vl(auVar39,auVar35,auVar35);
              fVar95 = (float)((uint)((byte)uVar24 & 1) * auVar35._0_4_);
              fVar94 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar35._4_4_);
              fVar93 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar35._8_4_);
              fVar90 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar35._12_4_);
              auVar81._0_4_ = fVar95 * auVar51._0_4_;
              auVar81._4_4_ = fVar94 * auVar51._4_4_;
              auVar81._8_4_ = fVar93 * auVar51._8_4_;
              auVar81._12_4_ = fVar90 * auVar51._12_4_;
              auVar35 = vminps_avx512vl(auVar81,auVar64);
              auVar85._0_4_ = fVar95 * auVar52._0_4_;
              auVar85._4_4_ = fVar94 * auVar52._4_4_;
              auVar85._8_4_ = fVar93 * auVar52._8_4_;
              auVar85._12_4_ = fVar90 * auVar52._12_4_;
              auVar39 = vminps_avx512vl(auVar85,auVar64);
              local_1898 = vsubps_avx512vl(auVar64,auVar35);
              local_1888 = vsubps_avx512vl(auVar64,auVar39);
              local_1868 = vpbroadcastd_avx512vl();
              local_1878 = vpbroadcastd_avx512vl();
              vpcmpeqd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar43));
              uStack_1854 = context->user->instID[0];
              local_1858 = uStack_1854;
              uStack_1850 = uStack_1854;
              uStack_184c = uStack_1854;
              uStack_1848 = context->user->instPrimID[0];
              uStack_1844 = uStack_1848;
              uStack_1840 = uStack_1848;
              uStack_183c = uStack_1848;
              auVar35 = vblendmps_avx512vl((undefined1  [16])local_1938,auVar42);
              bVar32 = (bool)(bVar19 >> 1 & 1);
              bVar6 = (bool)(bVar19 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar19 & 1) * auVar35._0_4_ | !(bool)(bVar19 & 1) * uStack_1848;
              *(uint *)(ray + 0x84) = (uint)bVar32 * auVar35._4_4_ | !bVar32 * uStack_1848;
              *(uint *)(ray + 0x88) = (uint)bVar6 * auVar35._8_4_ | !bVar6 * uStack_1848;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar19 >> 3) * auVar35._12_4_ | !(bool)(bVar19 >> 3) * uStack_1848;
              local_1958 = vpmovm2d_avx512vl(uVar34);
              args.valid = (int *)local_1958;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = local_18c8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              local_18c8 = (RTCHitN  [16])auVar41;
              local_18b8 = auVar43;
              local_18a8 = auVar65;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar98 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar104 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar103 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar102 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar101 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar100 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar99 = ZEXT1664(auVar35);
              }
              uVar34 = vptestmd_avx512vl(local_1958,local_1958);
              if ((uVar34 & 0xf) == 0) {
                uVar34 = 0;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar98 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar104 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar103 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar102 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar101 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar100 = ZEXT1664(auVar35);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar99 = ZEXT1664(auVar35);
                }
                uVar34 = vptestmd_avx512vl(local_1958,local_1958);
                uVar34 = uVar34 & 0xf;
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar32 = (bool)((byte)uVar34 & 1);
                auVar66._0_4_ =
                     (uint)bVar32 * auVar35._0_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x80);
                bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar66._4_4_ =
                     (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x84);
                bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar66._8_4_ =
                     (uint)bVar32 * auVar35._8_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x88);
                bVar32 = SUB81(uVar34 >> 3,0);
                auVar66._12_4_ =
                     (uint)bVar32 * auVar35._12_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar66;
              }
              bVar32 = (bool)((byte)uVar34 & 1);
              auVar68._0_4_ = (uint)bVar32 * *(int *)local_1948 | (uint)!bVar32 * local_1938.i[0];
              bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar68._4_4_ =
                   (uint)bVar32 * *(int *)(local_1948 + 4) | (uint)!bVar32 * local_1938.i[1];
              bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar68._8_4_ =
                   (uint)bVar32 * *(int *)(local_1948 + 8) | (uint)!bVar32 * local_1938.i[2];
              bVar32 = SUB81(uVar34 >> 3,0);
              auVar68._12_4_ =
                   (uint)bVar32 * *(int *)(local_1948 + 0xc) | (uint)!bVar32 * local_1938.i[3];
              *(undefined1 (*) [16])local_1948 = auVar68;
            }
            bVar20 = ((byte)uVar34 ^ 0xf) & bVar20;
          }
        }
      }
      if ((bVar20 == 0) || (bVar32 = 2 < uVar29, uVar29 = uVar29 + 1, bVar32)) break;
    }
    bVar17 = bVar17 & bVar20;
    if (bVar17 == 0) break;
  }
  bVar17 = bVar17 ^ 0xf;
LAB_006a6b0e:
  bVar27 = bVar27 | bVar17;
  if (bVar27 == 0xf) {
    bVar27 = 0xf;
    goto LAB_006a6c46;
  }
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar32 = (bool)(bVar27 >> 1 & 1);
  bVar6 = (bool)(bVar27 >> 2 & 1);
  bVar7 = (bool)(bVar27 >> 3 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar32 * auVar35._4_4_ | (uint)!bVar32 * tray.tfar.field_0.i[1];
  tray.tfar.field_0.i[0] =
       (uint)(bVar27 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar27 & 1) * tray.tfar.field_0.i[0];
  tray.tfar.field_0.i[2] = (uint)bVar6 * auVar35._8_4_ | (uint)!bVar6 * tray.tfar.field_0.i[2];
  tray.tfar.field_0.i[3] = (uint)bVar7 * auVar35._12_4_ | (uint)!bVar7 * tray.tfar.field_0.i[3];
  goto LAB_006a5c46;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }